

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_utf8.c
# Opt level: O0

int cm_utf8_is_valid(char *s)

{
  size_t sVar1;
  bool bVar2;
  uint local_2c;
  char *pcStack_28;
  uint pc;
  char *pos;
  char *last;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local._4_4_ = 0;
  }
  else {
    last = s;
    sVar1 = strlen(s);
    pos = s + sVar1;
    pcStack_28 = last;
    do {
      bVar2 = false;
      if (pcStack_28 != pos) {
        pcStack_28 = cm_utf8_decode_character(pcStack_28,pos,&local_2c);
        bVar2 = pcStack_28 != (char *)0x0;
      }
    } while (bVar2);
    s_local._4_4_ = (uint)(pcStack_28 == pos);
  }
  return s_local._4_4_;
}

Assistant:

int cm_utf8_is_valid(const char* s)
{
  if (!s) {
    return 0;
  }

  const char* last = s + strlen(s);
  const char* pos = s;
  unsigned int pc;

  while (pos != last && (pos = cm_utf8_decode_character(pos, last, &pc))) {
    /* Nothing to do. */
  }

  return pos == last;
}